

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O3

void luaC_freeall(lua_State *L)

{
  global_State *pgVar1;
  long lVar2;
  long lVar3;
  
  pgVar1 = L->l_G;
  pgVar1->currentwhite = 'C';
  sweeplist(L,&pgVar1->rootgc,0xfffffffffffffffd);
  if (0 < (pgVar1->strt).size) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      sweeplist(L,(GCObject **)((long)(pgVar1->strt).hash + lVar3),0xfffffffffffffffd);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar2 < (pgVar1->strt).size);
  }
  return;
}

Assistant:

void luaC_freeall (lua_State *L) {
  global_State *g = G(L);
  int i;
  g->currentwhite = WHITEBITS | bitmask(SFIXEDBIT);  /* mask to collect all elements */
  sweepwholelist(L, &g->rootgc);
  for (i = 0; i < g->strt.size; i++)  /* free all string lists */
    sweepwholelist(L, &g->strt.hash[i]);
}